

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorFactory.cpp
# Opt level: O0

shared_ptr<adios2::core::Operator> adios2::core::MakeOperator(string *type,Params *parameters)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<adios2::core::Operator> sVar3;
  string typeLowerCase;
  shared_ptr<adios2::core::Operator> *ret;
  shared_ptr<adios2::core::compress::CompressNull> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdd8;
  int commRank;
  element_type *input;
  string *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  undefined1 local_191 [40];
  allocator local_169;
  string local_168 [32];
  string local_148 [32];
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [112];
  string local_40 [39];
  byte local_19;
  
  local_19 = 0;
  input = in_RDI;
  std::shared_ptr<adios2::core::Operator>::shared_ptr
            ((shared_ptr<adios2::core::Operator> *)in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffda8);
  helper::LowerCase<std::__cxx11::string>((string *)input);
  bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  if (((((!bVar1) &&
        (bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8),
        !bVar1)) &&
       (bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8), !bVar1
       )) && ((bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8),
              !bVar1 && (bVar1 = std::operator==(in_stack_fffffffffffffdb0,
                                                 (char *)in_stack_fffffffffffffda8), !bVar1)))) &&
     (bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8), !bVar1))
  {
    bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
    if (bVar1) {
      std::
      make_shared<adios2::core::compress::CompressPNG,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                (in_stack_fffffffffffffdd8);
      std::shared_ptr<adios2::core::Operator>::operator=
                ((shared_ptr<adios2::core::Operator> *)in_stack_fffffffffffffdb0,
                 (shared_ptr<adios2::core::compress::CompressPNG> *)in_stack_fffffffffffffda8);
      std::shared_ptr<adios2::core::compress::CompressPNG>::~shared_ptr
                ((shared_ptr<adios2::core::compress::CompressPNG> *)0x97aec6);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      if (bVar1) {
        std::
        make_shared<adios2::core::compress::CompressSirius,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                  (in_stack_fffffffffffffdd8);
        std::shared_ptr<adios2::core::Operator>::operator=
                  ((shared_ptr<adios2::core::Operator> *)in_stack_fffffffffffffdb0,
                   (shared_ptr<adios2::core::compress::CompressSirius> *)in_stack_fffffffffffffda8);
        std::shared_ptr<adios2::core::compress::CompressSirius>::~shared_ptr
                  ((shared_ptr<adios2::core::compress::CompressSirius> *)0x97af25);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        if (((!bVar1) &&
            (bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8),
            !bVar1)) &&
           (bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8),
           !bVar1)) {
          bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
          if (bVar1) {
            std::
            make_shared<adios2::plugin::PluginOperator,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                      (in_stack_fffffffffffffdd8);
            std::shared_ptr<adios2::core::Operator>::operator=
                      ((shared_ptr<adios2::core::Operator> *)in_stack_fffffffffffffdb0,
                       (shared_ptr<adios2::plugin::PluginOperator> *)in_stack_fffffffffffffda8);
            std::shared_ptr<adios2::plugin::PluginOperator>::~shared_ptr
                      ((shared_ptr<adios2::plugin::PluginOperator> *)0x97afff);
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
            if (bVar1) {
              std::
              make_shared<adios2::core::compress::CompressNull,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                        (in_stack_fffffffffffffdd8);
              std::shared_ptr<adios2::core::Operator>::operator=
                        ((shared_ptr<adios2::core::Operator> *)in_stack_fffffffffffffdb0,
                         in_stack_fffffffffffffda8);
              std::shared_ptr<adios2::core::compress::CompressNull>::~shared_ptr
                        ((shared_ptr<adios2::core::compress::CompressNull> *)0x97b05e);
            }
            else {
              paVar4 = &local_b1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_b0,"Operator",paVar4);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_d8,"OperatorFactory",&local_d9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_100,"MakeOperator",&local_101);
              std::operator+((char *)input,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_RDI);
              std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
              helper::Throw<std::invalid_argument>
                        (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                         in_stack_fffffffffffffe00,(string *)input,(int)((ulong)in_RDI >> 0x20));
              std::__cxx11::string::~string(local_128);
              std::__cxx11::string::~string(local_148);
              std::__cxx11::string::~string(local_100);
              std::allocator<char>::~allocator((allocator<char> *)&local_101);
              std::__cxx11::string::~string(local_d8);
              std::allocator<char>::~allocator((allocator<char> *)&local_d9);
              std::__cxx11::string::~string(local_b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_b1);
            }
          }
        }
      }
    }
  }
  bVar1 = std::operator==((shared_ptr<adios2::core::Operator> *)in_stack_fffffffffffffdb0,
                          in_stack_fffffffffffffda8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"Operator",&local_169);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_191;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_191 + 1),"OperatorFactory",(allocator *)__lhs);
    paVar4 = &local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"MakeOperator",paVar4);
    std::operator+((char *)input,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    commRank = (int)((ulong)in_RDI >> 0x20);
    std::operator+(__lhs,(char *)paVar4);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (string *)input,commRank);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::__cxx11::string::~string((string *)(local_191 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_191);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  local_19 = 1;
  std::__cxx11::string::~string(local_40);
  _Var2._M_pi = extraout_RDX;
  if ((local_19 & 1) == 0) {
    std::shared_ptr<adios2::core::Operator>::~shared_ptr
              ((shared_ptr<adios2::core::Operator> *)0x97b555);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = input;
  return (shared_ptr<adios2::core::Operator>)
         sVar3.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Operator> MakeOperator(const std::string &type, const Params &parameters)
{
    std::shared_ptr<Operator> ret = nullptr;

    const std::string typeLowerCase = helper::LowerCase(type);

    if (typeLowerCase == "bigwhoop")
    {
#ifdef ADIOS2_HAVE_BIGWHOOP
        ret = std::make_shared<compress::CompressBigWhoop>(parameters);
#endif
    }
    else if (typeLowerCase == "blosc")
    {
#ifdef ADIOS2_HAVE_BLOSC2
        ret = std::make_shared<compress::CompressBlosc>(parameters);
#endif
    }
    else if (typeLowerCase == "bzip2")
    {
#ifdef ADIOS2_HAVE_BZIP2
        ret = std::make_shared<compress::CompressBZIP2>(parameters);
#endif
    }
    else if (typeLowerCase == "libpressio")
    {
#ifdef ADIOS2_HAVE_LIBPRESSIO
        ret = std::make_shared<compress::CompressLibPressio>(parameters);
#endif
    }
    else if (typeLowerCase == "mgard")
    {
#ifdef ADIOS2_HAVE_MGARD
        ret = std::make_shared<compress::CompressMGARD>(parameters);
#endif
    }
    else if (typeLowerCase == "mgardplus")
    {
#ifdef ADIOS2_HAVE_MGARD
        ret = std::make_shared<compress::CompressMGARDPlus>(parameters);
#endif
    }
    else if (typeLowerCase == "png")
    {
#ifdef ADIOS2_HAVE_PNG
        ret = std::make_shared<compress::CompressPNG>(parameters);
#endif
    }
    else if (typeLowerCase == "sirius")
    {
#ifdef ADIOS2_HAVE_MHS
        ret = std::make_shared<compress::CompressSirius>(parameters);
#endif
    }
    else if (typeLowerCase == "sz")
    {
#ifdef ADIOS2_HAVE_SZ
        ret = std::make_shared<compress::CompressSZ>(parameters);
#endif
    }
    else if (typeLowerCase == "zfp")
    {
#ifdef ADIOS2_HAVE_ZFP
        ret = std::make_shared<compress::CompressZFP>(parameters);
#endif
    }
    else if (typeLowerCase == "mdr")
    {
#ifdef ADIOS2_HAVE_MGARD_MDR
        ret = std::make_shared<refactor::RefactorMDR>(parameters);
#endif
    }
    else if (typeLowerCase == "plugin")
    {
        ret = std::make_shared<plugin::PluginOperator>(parameters);
    }
    else if (typeLowerCase == "null")
    {
        ret = std::make_shared<compress::CompressNull>(parameters);
    }
    else
    {
        helper::Throw<std::invalid_argument>("Operator", "OperatorFactory", "MakeOperator",
                                             "ADIOS2 does not support " + typeLowerCase +
                                                 " operation");
    }

    if (ret == nullptr)
    {
        helper::Throw<std::invalid_argument>("Operator", "OperatorFactory", "MakeOperator",
                                             "ADIOS2 didn't compile with " + typeLowerCase +
                                                 " library, operator not added");
    }

    return ret;
}